

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

void __thiscall
NNTreeImpl::NNTreeImpl
          (NNTreeImpl *this,NNTreeDetails *details,QPDF *qpdf,QPDFObjectHandle *oh,bool auto_repair)

{
  bool auto_repair_local;
  QPDFObjectHandle *oh_local;
  QPDF *qpdf_local;
  NNTreeDetails *details_local;
  NNTreeImpl *this_local;
  
  this->details = details;
  this->qpdf = qpdf;
  this->split_threshold = 0x20;
  QPDFObjectHandle::QPDFObjectHandle(&this->oh,oh);
  this->auto_repair = auto_repair;
  return;
}

Assistant:

NNTreeImpl::NNTreeImpl(
    NNTreeDetails const& details, QPDF& qpdf, QPDFObjectHandle& oh, bool auto_repair) :
    details(details),
    qpdf(qpdf),
    split_threshold(32),
    oh(oh),
    auto_repair(auto_repair)
{
}